

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::BasicSharedStruct::Purpose_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  BasicSharedStruct *this_local;
  
  local_18 = this;
  this_local = (BasicSharedStruct *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "\n1. Verify that vectors, matrices, structers and arrays of those can be used\n    as a shared memory.\n2. Verify that shared memory can be indexed with constant values, built-in\n    variables and dynamic expressions.\n3. Verify that memoryBarrierAtomicCounter(), memoryBarrierImage(), memoryBarrier(),\n     memoryBarrierBuffer() and memoryBarrierShared() built-in functions are accepted\n     by the GLSL compiler."
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Purpose()
	{
		return NL "1. Verify that vectors, matrices, structers and arrays of those can be used" NL
				  "    as a shared memory." NL
				  "2. Verify that shared memory can be indexed with constant values, built-in" NL
				  "    variables and dynamic expressions." NL
				  "3. Verify that memoryBarrierAtomicCounter(), memoryBarrierImage(), memoryBarrier()," NL
				  "     memoryBarrierBuffer() and memoryBarrierShared() built-in functions are accepted" NL
				  "     by the GLSL compiler.";
	}